

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::addTranslator(CoreBroker *this,ActionMessage *message)

{
  GlobalFederateId fed_id;
  InterfaceHandle IVar1;
  byte *pbVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  BaseTimeCoordinator *pBVar6;
  string_view type;
  string_view units;
  bool bVar7;
  int iVar8;
  string *psVar9;
  BasicHandleInfo *handleInfo;
  iterator iVar10;
  string_view key;
  ActionMessage add;
  ActionMessage local_e8;
  
  bVar7 = checkInterfaceCreation(this,message,TRANSLATOR);
  if (bVar7) {
    fed_id.gid = (message->source_id).gid;
    IVar1.hid = (message->source_handle).hid;
    pbVar2 = (message->payload).heap;
    sVar3 = (message->payload).bufferSize;
    psVar9 = ActionMessage::getString_abi_cxx11_(message,0);
    pcVar4 = (psVar9->_M_dataplus)._M_p;
    sVar5 = psVar9->_M_string_length;
    psVar9 = ActionMessage::getString_abi_cxx11_(message,1);
    type._M_str = pcVar4;
    type._M_len = sVar5;
    units._M_str = (psVar9->_M_dataplus)._M_p;
    units._M_len = psVar9->_M_string_length;
    key._M_str = (char *)pbVar2;
    key._M_len = sVar3;
    handleInfo = HandleManager::addHandle(&this->handles,fed_id,IVar1,TRANSLATOR,key,type,units);
    iVar10 = CLI::std::
             _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->global_id_translation)._M_h,&message->source_id);
    if (iVar10.
        super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false>
        ._M_cur != (__node_type *)0x0) {
      (handleInfo->local_fed_id).fid =
           *(BaseType *)
            ((long)iVar10.
                   super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>,_false>
                   ._M_cur + 0xc);
    }
    handleInfo->flags = message->flags;
    if ((this->super_BrokerBase).field_0x294 != '\0') {
      psVar9 = &handleInfo->key;
      findAndNotifyInputTargets(this,handleInfo,psVar9);
      findAndNotifyPublicationTargets(this,handleInfo,psVar9);
      findAndNotifyEndpointTargets(this,handleInfo,psVar9);
      return;
    }
    (*(this->super_Broker)._vptr_Broker[0x22])(this,0,message);
    if ((((this->super_BrokerBase).hasFilters == false) &&
        ((this->super_BrokerBase).hasFilters = true, (this->super_BrokerBase).globalTime == false))
       && ((this->super_BrokerBase).asyncTime == false)) {
      pBVar6 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      iVar8 = (*pBVar6->_vptr_BaseTimeCoordinator[5])
                        (pBVar6,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
      if ((char)iVar8 != '\0') {
        (this->super_BrokerBase).hasTimeDependency = true;
        ActionMessage::ActionMessage
                  (&local_e8,cmd_add_dependency,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
        local_e8.flags._1_1_ = local_e8.flags._1_1_ | 0x40;
        (*(this->super_Broker)._vptr_Broker[0x22])(this,0,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::addTranslator(ActionMessage& message)
{
    if (!checkInterfaceCreation(message, InterfaceType::TRANSLATOR)) {
        return;
    }
    auto& trans = handles.addHandle(message.source_id,
                                    message.source_handle,
                                    InterfaceType::TRANSLATOR,
                                    message.name(),
                                    message.getString(typeStringLoc),
                                    message.getString(typeOutStringLoc));
    addLocalInfo(trans, message);

    if (!isRootc) {
        transmit(parent_route_id, message);
        if (!hasFilters) {
            hasFilters = true;
            if (!globalTime && !asyncTime) {
                if (timeCoord->addDependent(higher_broker_id)) {
                    hasTimeDependency = true;
                    ActionMessage add(CMD_ADD_DEPENDENCY, global_broker_id_local, higher_broker_id);
                    setActionFlag(add, child_flag);
                    transmit(parent_route_id, add);
                }
            }
        }
    } else {
        findAndNotifyInputTargets(trans, trans.key);
        findAndNotifyPublicationTargets(trans, trans.key);
        findAndNotifyEndpointTargets(trans, trans.key);
    }
}